

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::AddGlyph(ImFont *this,ImFontConfig *cfg,ImWchar codepoint,float x0,float y0,float x1,
                float y1,float u0,float v0,float u1,float v1,float advance_x)

{
  ImFontAtlas *pIVar1;
  ImFontGlyph *pIVar2;
  uint uVar3;
  float fVar4;
  float local_68;
  float local_58;
  float local_48;
  
  if (cfg == (ImFontConfig *)0x0) {
    local_68 = advance_x;
    local_58 = x0;
    local_48 = x1;
  }
  else {
    fVar4 = cfg->GlyphMaxAdvanceX;
    if (advance_x <= cfg->GlyphMaxAdvanceX) {
      fVar4 = advance_x;
    }
    uVar3 = -(uint)(advance_x < cfg->GlyphMinAdvanceX);
    local_68 = (float)(uVar3 & (uint)cfg->GlyphMinAdvanceX | ~uVar3 & (uint)fVar4);
    if ((local_68 != advance_x) || (NAN(local_68) || NAN(advance_x))) {
      fVar4 = (local_68 - advance_x) * 0.5;
      if ((cfg->PixelSnapH & 1U) != 0) {
        fVar4 = (float)(int)fVar4;
      }
      x0 = x0 + fVar4;
      x1 = x1 + fVar4;
    }
    if ((cfg->PixelSnapH & 1U) != 0) {
      local_68 = (float)(int)(local_68 + 0.5);
    }
    local_68 = local_68 + (cfg->GlyphExtraSpacing).x;
    local_58 = x0;
    local_48 = x1;
  }
  ImVector<ImFontGlyph>::resize(&this->Glyphs,(this->Glyphs).Size + 1);
  pIVar2 = ImVector<ImFontGlyph>::back(&this->Glyphs);
  *(uint *)pIVar2 = (uint)codepoint * 4 + (-(uint)(y0 != y1 && local_58 != local_48) & 1) * 2;
  pIVar2->X0 = local_58;
  pIVar2->Y0 = y0;
  pIVar2->X1 = local_48;
  pIVar2->Y1 = y1;
  pIVar2->U0 = u0;
  pIVar2->V0 = v0;
  pIVar2->U1 = u1;
  pIVar2->V1 = v1;
  pIVar2->AdvanceX = local_68;
  pIVar1 = this->ContainerAtlas;
  fVar4 = (float)pIVar1->TexGlyphPadding + 0.99;
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface =
       this->MetricsTotalSurface +
       (int)((float)pIVar1->TexHeight * (v1 - v0) + fVar4) *
       (int)((float)pIVar1->TexWidth * (u1 - u0) + fVar4);
  return;
}

Assistant:

void ImFont::AddGlyph(const ImFontConfig* cfg, ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    if (cfg != NULL)
    {
        // Clamp & recenter if needed
        const float advance_x_original = advance_x;
        advance_x = ImClamp(advance_x, cfg->GlyphMinAdvanceX, cfg->GlyphMaxAdvanceX);
        if (advance_x != advance_x_original)
        {
            float char_off_x = cfg->PixelSnapH ? ImFloor((advance_x - advance_x_original) * 0.5f) : (advance_x - advance_x_original) * 0.5f;
            x0 += char_off_x;
            x1 += char_off_x;
        }

        // Snap to pixel
        if (cfg->PixelSnapH)
            advance_x = IM_ROUND(advance_x);

        // Bake spacing
        advance_x += cfg->GlyphExtraSpacing.x;
    }

    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.Colored = false;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x;

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    // We use (U1-U0)*TexWidth instead of X1-X0 to account for oversampling.
    float pad = ContainerAtlas->TexGlyphPadding + 0.99f;
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + pad) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + pad);
}